

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

string_t __thiscall
duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>::
Operation<duckdb::hugeint_t,duckdb::string_t>
          (VectorStringCastOperator<duckdb::NumericTryCastToBit> *this,hugeint_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  anon_union_16_2_67f50693_for_value aVar1;
  string_t data;
  hugeint_t numeric;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  string local_30;
  
  numeric.upper = input.lower;
  numeric.lower = (uint64_t)this;
  Bit::NumericToBit<duckdb::hugeint_t>(&local_30,numeric);
  if ((uint)local_30._M_string_length < 0xd) {
    uStack_34 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    if ((uint)local_30._M_string_length != 0) {
      switchD_00b1422a::default
                (&uStack_3c,local_30._M_dataplus._M_p,(ulong)((uint)local_30._M_string_length & 0xf)
                );
    }
  }
  else {
    uStack_3c = *(undefined4 *)local_30._M_dataplus._M_p;
    uStack_38 = SUB84(local_30._M_dataplus._M_p,0);
    uStack_34 = (undefined4)((ulong)local_30._M_dataplus._M_p >> 0x20);
  }
  data.value._4_1_ = (undefined1)uStack_34;
  data.value._5_1_ = uStack_34._1_1_;
  data.value._6_1_ = uStack_34._2_1_;
  data.value._7_1_ = uStack_34._3_1_;
  data.value.pointer.length = uStack_38;
  data.value.pointer.ptr = (char *)mask;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob
                 ((StringVector *)idx,(Vector *)CONCAT44(uStack_3c,(uint)local_30._M_string_length),
                  data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}